

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDDisplayParameters *
ON_SubDDisplayParameters::CreateFromAbsoluteDisplayDensity
          (ON_SubDDisplayParameters *__return_storage_ptr__,uint absolute_subd_display_density)

{
  uint local_c;
  uint absolute_subd_display_density_local;
  
  local_c = absolute_subd_display_density;
  if (6 < absolute_subd_display_density) {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,0xf56,"","absolute_subd_display_density parameter is too large.");
    local_c = 4;
  }
  ON_SubDDisplayParameters(__return_storage_ptr__);
  __return_storage_ptr__->m_display_density = (uchar)local_c;
  __return_storage_ptr__->m_bDisplayDensityIsAbsolute = true;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDDisplayParameters ON_SubDDisplayParameters::CreateFromAbsoluteDisplayDensity(
  unsigned int absolute_subd_display_density
  )
{
  if (absolute_subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
  {
    ON_SUBD_ERROR("absolute_subd_display_density parameter is too large.");
    absolute_subd_display_density = ON_SubDDisplayParameters::DefaultDensity;
  }

  ON_SubDDisplayParameters limit_mesh_parameters;
  limit_mesh_parameters.m_display_density = (unsigned char)absolute_subd_display_density;
  limit_mesh_parameters.m_bDisplayDensityIsAbsolute = true;
  return limit_mesh_parameters;
}